

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gui.test.cpp
# Opt level: O0

Vector3f convertRgbToHsv(Vector3f *rgb)

{
  float Z;
  Vector3f VVar1;
  float *pfVar2;
  float *in_RDI;
  double dVar3;
  float hue;
  float chroma;
  float value;
  float local_44;
  float local_24;
  Vector3<float> local_c;
  
  pfVar2 = std::max<float>(in_RDI,in_RDI + 1);
  pfVar2 = std::max<float>(pfVar2,in_RDI + 2);
  Z = *pfVar2;
  pfVar2 = std::min<float>(in_RDI,in_RDI + 1);
  pfVar2 = std::min<float>(pfVar2,in_RDI + 2);
  local_44 = Z - *pfVar2;
  if ((local_44 != 0.0) || (NAN(local_44))) {
    if ((Z != *in_RDI) || (NAN(Z) || NAN(*in_RDI))) {
      if ((Z != in_RDI[1]) || (NAN(Z) || NAN(in_RDI[1]))) {
        local_24 = (*in_RDI - in_RDI[1]) / local_44 + 4.0;
      }
      else {
        local_24 = (in_RDI[2] - *in_RDI) / local_44 + 2.0;
      }
    }
    else {
      local_24 = (in_RDI[1] - in_RDI[2]) / local_44 + 6.0;
    }
  }
  else {
    local_24 = 0.0;
  }
  dVar3 = std::fmod((double)(ulong)(uint)local_24,5.36715732285162e-315);
  if ((Z != 0.0) || (NAN(Z))) {
    local_44 = local_44 / Z;
  }
  else {
    local_44 = 0.0;
  }
  sf::Vector3<float>::Vector3(&local_c,SUB84(dVar3,0) / 6.0,local_44,Z);
  VVar1.z = local_c.z;
  VVar1.x = local_c.x;
  VVar1.y = local_c.y;
  return VVar1;
}

Assistant:

sf::Vector3f convertRgbToHsv(const sf::Vector3f& rgb) {
    float value = std::max(std::max(rgb.x, rgb.y), rgb.z);
    float chroma = value - std::min(std::min(rgb.x, rgb.y), rgb.z);
    float hue;
    if (chroma == 0.0f) {
        hue = 0.0f;
    } else if (value == rgb.x) {
        hue = (rgb.y - rgb.z) / chroma + 6.0f;
    } else if (value == rgb.y) {
        hue = (rgb.z - rgb.x) / chroma + 2.0f;
    } else {    // value == rgb.z
        hue = (rgb.x - rgb.y) / chroma + 4.0f;
    }
    hue = std::fmod(hue, 6.0f) / 6.0f;

    return {
        hue, (value == 0.0f ? 0.0f : chroma / value), value
    };
}